

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockDXT.cpp
# Opt level: O1

void __thiscall nv::BlockATI1::flip2(BlockATI1 *this)

{
  uint uVar1;
  
  uVar1 = *(uint *)&(this->alpha).field_0;
  *(uint *)&(this->alpha).field_0 =
       uVar1 >> 0xc & 0xfff | (uVar1 & 0xfff) << 0xc | uVar1 & 0xff000000;
  return;
}

Assistant:

void AlphaBlockDXT5::flip2()
{
	uint * b = (uint *)this;
	
	// @@ The masks might have to be byte swapped.
	uint tmp = (*b & 0xFF000000);
	tmp |=  (*b & 0x00000FFF) << 12;
	tmp |= (*b & 0x00FFF000) >> 12;
	
	*b = tmp;
}